

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void fio_ary_____require_on_bottom(fio_ary___s *ary,size_t len)

{
  FIOBJ *ptr;
  ulong uVar1;
  FIOBJ *pFVar2;
  int *piVar3;
  long lVar4;
  FIOBJ *tmp;
  size_t len_local;
  fio_ary___s *ary_local;
  
  if (ary->start < len) {
    ptr = ary->arry;
    uVar1 = ((len - ary->start) + ary->end & 0xfffffffffffffffe) + 2;
    if (ary->capa <= uVar1) {
      pFVar2 = (FIOBJ *)fio_malloc(uVar1 * 8);
      ary->arry = pFVar2;
      if (ary->arry == (FIOBJ *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4933"
                        );
        }
        kill(0,2);
        piVar3 = __errno_location();
        exit(*piVar3);
      }
      ary->capa = uVar1;
    }
    lVar4 = ary->end - ary->start;
    ary->end = ary->capa;
    if (lVar4 != 0) {
      memmove(ary->arry + (ary->capa - lVar4),ptr + ary->start,lVar4 * 8);
    }
    ary->start = ary->end - lVar4;
    if (ptr != ary->arry) {
      fio_free(ptr);
    }
  }
  return;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}